

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O2

Allocation * __thiscall
density::detail::
LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)3>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  LfQueueControl *i_atomic;
  ulong uVar1;
  uintptr_t uVar2;
  ulong uVar3;
  void *pvVar4;
  size_t sVar5;
  uintptr_t *i_atomic_00;
  
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Dead | LfQueue_External | LfQueue_Busy)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
               ,0x78);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
               ,0x79);
  }
  sVar5 = 8;
  if (8 < i_alignment) {
    sVar5 = i_alignment;
  }
  uVar3 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    uVar3 = i_size;
  }
  do {
    uVar1 = this->m_tail;
    if (uVar1 == 0 || (uVar1 & 0x3f) != 0) {
      density_tests::detail::assert_failed<>
                ("m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                 ,0x84);
      uVar1 = this->m_tail;
    }
    pvVar4 = (void *)(uVar1 + sVar5 + (ulong)i_include_type * 8 + 7 & -sVar5);
    i_atomic_00 = (uintptr_t *)(uVar3 + 0x3f + (long)pvVar4 & 0xffffffffffffffc0);
    if ((long)i_atomic_00 - (uVar1 & 0xffffffffffff0000) < 0xffc1) {
      raw_atomic_store(i_atomic_00,0,memory_order_seq_cst);
      i_atomic = (LfQueueControl *)this->m_tail;
      uVar2 = raw_atomic_load((uintptr_t *)i_atomic,memory_order_seq_cst);
      if (uVar2 != 0) {
        density_tests::detail::assert_failed<>
                  ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                   ,0xa9);
      }
      raw_atomic_store((uintptr_t *)i_atomic,i_control_bits + (long)i_atomic_00,memory_order_seq_cst
                      );
      this->m_tail = (uintptr_t)i_atomic_00;
      __return_storage_ptr__->m_control_block = i_atomic;
      __return_storage_ptr__->m_next_ptr = i_control_bits + (long)i_atomic_00;
      goto LAB_0110e041;
    }
    if (0xffb0 < (sVar5 + uVar3) - 8) {
      pvVar4 = (void *)0x0;
      goto LAB_0110e041;
    }
    uVar2 = page_overflow(this,LfQueue_WaitFree);
  } while (uVar2 != 0);
  pvVar4 = (void *)0x0;
LAB_0110e041:
  __return_storage_ptr__->m_user_storage = pvVar4;
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Dead | LfQueue_External | LfQueue_Busy)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    auto new_tail =
                      m_tail + (i_include_type ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    new_tail                = uint_upper_align(new_tail, i_alignment);
                    auto const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + i_size, s_alloc_granularity);

                    // check for page overflow
                    auto const page_start =
                      uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    auto const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* null-terminate the next control-block before updating the new one, to prevent 
                            consumers from reaching an unitialized area. No memory ordering is required here */
                        raw_atomic_store(
                          &reinterpret_cast<ControlBlock *>(new_tail)->m_next,
                          uintptr_t(0),
                          mem_relaxed);
                        /* to investigate: this may probably be a non-atomic operation, because consumers can only
                            read this after acquiring the next write (to new_block->m_next). Anyway clang tsan
                            has reported it has a data race. Furthermore atomicity in this case should have no 
                            consequences on the generated code. 
                        
                            todo: the std::atomic_thread_fence in the page_allocator should be enough
                        */

                        /* setup the new control block. Here we use release ordering so that consumers
                            acquiring this control block can see the previous write. */
                        auto const new_block = reinterpret_cast<ControlBlock *>(m_tail);
                        auto const next_ptr  = new_tail + i_control_bits;
                        DENSITY_ASSERT_INTERNAL(
                          raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                        raw_atomic_store(&new_block->m_next, next_ptr, mem_release);

                        // commit the allocation
                        m_tail = new_tail;
                        return {new_block, next_ptr, user_storage};
                    }
                    else if (
                      i_size + (i_alignment - min_alignment) <=
                      s_max_size_inpage) // if this allocation may fit in a page
                    {
                        /* allocate another page. Note: on success page_overflow sets m_tail to the beginning of
                            the new page */
                        auto const result = page_overflow(PROGRESS_GUARANTEE);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (result == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            // with LfQueue_Throwing page_overflow throws on failure
                            DENSITY_ASSUME(result != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          i_control_bits, i_size, i_alignment);
                    }
                }
            }